

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

bool __thiscall p2t::Sweep::Incircle(Sweep *this,Point *pa,Point *pb,Point *pc,Point *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = pd->x;
  dVar7 = pd->y;
  dVar1 = pa->x - dVar4;
  dVar6 = pa->y - dVar7;
  dVar2 = pb->x - dVar4;
  dVar5 = pb->y - dVar7;
  dVar3 = dVar1 * dVar5 - dVar6 * dVar2;
  if (0.0 < dVar3) {
    dVar4 = pc->x - dVar4;
    dVar7 = pc->y - dVar7;
    dVar8 = dVar6 * dVar4 - dVar1 * dVar7;
    if (0.0 < dVar8) {
      return 0.0 < (dVar4 * dVar4 + dVar7 * dVar7) * dVar3 +
                   (dVar2 * dVar2 + dVar5 * dVar5) * dVar8 +
                   (dVar1 * dVar1 + dVar6 * dVar6) * (dVar2 * dVar7 - dVar5 * dVar4);
    }
  }
  return false;
}

Assistant:

bool Sweep::Incircle(const Point& pa, const Point& pb, const Point& pc, const Point& pd) const
{
  const double adx = pa.x - pd.x;
  const double ady = pa.y - pd.y;
  const double bdx = pb.x - pd.x;
  const double bdy = pb.y - pd.y;

  const double adxbdy = adx * bdy;
  const double bdxady = bdx * ady;
  const double oabd = adxbdy - bdxady;

  if (oabd <= 0)
    return false;

  const double cdx = pc.x - pd.x;
  const double cdy = pc.y - pd.y;

  const double cdxady = cdx * ady;
  const double adxcdy = adx * cdy;
  const double ocad = cdxady - adxcdy;

  if (ocad <= 0)
    return false;

  const double bdxcdy = bdx * cdy;
  const double cdxbdy = cdx * bdy;

  const double alift = adx * adx + ady * ady;
  const double blift = bdx * bdx + bdy * bdy;
  const double clift = cdx * cdx + cdy * cdy;

  const double det = alift * (bdxcdy - cdxbdy) + blift * ocad + clift * oabd;

  return det > 0;
}